

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O1

void dinf_norm_error(int nrhs,SuperMatrix *X,double *xtrue)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (0 < nrhs) {
    piVar1 = (int *)X->Store;
    lVar2 = *(long *)(piVar1 + 2);
    iVar4 = 0;
    do {
      dVar5 = NAN;
      if (0 < (long)X->nrow) {
        dVar5 = 0.0;
        lVar3 = 0;
        dVar6 = 0.0;
        do {
          dVar7 = *(double *)((long)(*piVar1 * iVar4) * 8 + lVar2 + lVar3 * 8);
          dVar8 = ABS(dVar7 - xtrue[lVar3]);
          if (dVar5 <= dVar8) {
            dVar5 = dVar8;
          }
          dVar7 = ABS(dVar7);
          if (dVar6 <= dVar7) {
            dVar6 = dVar7;
          }
          lVar3 = lVar3 + 1;
        } while (X->nrow != lVar3);
        dVar5 = dVar5 / dVar6;
      }
      printf("||X - Xtrue||/||X|| = %e\n",dVar5);
      iVar4 = iVar4 + 1;
    } while (iVar4 != nrhs);
  }
  return;
}

Assistant:

void dinf_norm_error(int nrhs, SuperMatrix *X, double *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    double *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}